

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O3

void __thiscall
Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcBonesOut)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  double dVar3;
  uchar *puVar4;
  pointer paVar5;
  IntBone_MDL7 *pIVar6;
  pointer paVar7;
  undefined8 uVar8;
  aiAnimation *this_00;
  ulong uVar9;
  aiNodeAnim **ppaVar10;
  aiNodeAnim *paVar11;
  aiVectorKey *paVar12;
  aiQuatKey *paVar13;
  aiQuatKey *paVar14;
  aiAnimation **ppaVar15;
  pointer paVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  IntBone_MDL7 *intBone;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  uint local_464;
  undefined1 local_430 [1024];
  
  if (apcBonesOut == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcBonesOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/MDL/MDLLoader.cpp"
                  ,0x6c8,
                  "void Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(const MDL::IntBone_MDL7 **)"
                 );
  }
  puVar4 = this->mBuffer;
  this_00 = (aiAnimation *)operator_new(0x448);
  uVar17 = 0;
  (this_00->mName).length = 0;
  (this_00->mName).data[0] = '\0';
  memset((this_00->mName).data + 1,0x1b,0x3ff);
  this_00->mDuration = -1.0;
  this_00->mTicksPerSecond = 0.0;
  this_00->mNumChannels = 0;
  this_00->mChannels = (aiNodeAnim **)0x0;
  this_00->mNumMeshChannels = 0;
  this_00->mMeshChannels = (aiMeshAnim **)0x0;
  this_00->mNumMorphMeshChannels = 0;
  this_00->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar21 = (ulong)*(uint *)(puVar4 + 8);
  if (uVar21 == 0) {
    ppaVar10 = (aiNodeAnim **)operator_new__(0);
    this_00->mChannels = ppaVar10;
  }
  else {
    uVar23 = 0;
    uVar25 = 0xbff00000;
    uVar9 = 0;
    do {
      paVar16 = (apcBonesOut[uVar9]->pkeyPositions).
                super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                super__Vector_impl_data._M_start;
      paVar5 = (apcBonesOut[uVar9]->pkeyPositions).
               super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (paVar16 != paVar5) {
        lVar18 = (long)paVar5 - (long)paVar16;
        uVar22 = 0;
        uVar24 = uVar23;
        uVar26 = uVar25;
        do {
          dVar3 = paVar16->mTime;
          uVar23 = SUB84(dVar3,0);
          uVar25 = (int)((ulong)dVar3 >> 0x20);
          if (dVar3 <= (double)CONCAT44(uVar26,uVar24)) {
            uVar23 = uVar24;
            uVar25 = uVar26;
          }
          this_00->mDuration = (double)CONCAT44(uVar25,uVar23);
          uVar22 = uVar22 + 1;
          paVar16 = paVar16 + 1;
          uVar24 = uVar23;
          uVar26 = uVar25;
        } while (uVar22 < (ulong)((lVar18 >> 3) * -0x5555555555555555));
        uVar20 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar20;
        this_00->mNumChannels = uVar20;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar21);
    if (((double)CONCAT44(uVar25,uVar23) == 0.0) && (!NAN((double)CONCAT44(uVar25,uVar23)))) {
      aiAnimation::~aiAnimation(this_00);
      operator_delete(this_00,0x448);
      return;
    }
    ppaVar10 = (aiNodeAnim **)operator_new__(uVar17 << 3);
    this_00->mChannels = ppaVar10;
    if (uVar21 != 0) {
      uVar17 = 0;
      local_464 = 0;
      do {
        pIVar6 = apcBonesOut[uVar17];
        if ((pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pIVar6->pkeyPositions).super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          paVar11 = (aiNodeAnim *)operator_new(0x438);
          (paVar11->mNodeName).length = 0;
          (paVar11->mNodeName).data[0] = '\0';
          memset((paVar11->mNodeName).data + 1,0x1b,0x3ff);
          paVar11->mRotationKeys = (aiQuatKey *)0x0;
          paVar11->mNumScalingKeys = 0;
          *(undefined8 *)&paVar11->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar11->mPositionKeys + 4) = 0;
          paVar11->mScalingKeys = (aiVectorKey *)0x0;
          paVar11->mPreState = aiAnimBehaviour_DEFAULT;
          paVar11->mPostState = aiAnimBehaviour_DEFAULT;
          this_00->mChannels[local_464] = paVar11;
          uVar20 = (pIVar6->super_aiBone).mName.length;
          if (0x3fe < uVar20) {
            uVar20 = 0x3ff;
          }
          uVar21 = (ulong)uVar20;
          memcpy(local_430,(pIVar6->super_aiBone).mName.data,uVar21);
          local_430[uVar21] = 0;
          (paVar11->mNodeName).length = uVar20;
          memcpy((paVar11->mNodeName).data,local_430,uVar21);
          (paVar11->mNodeName).data[uVar21] = '\0';
          uVar9 = ((long)(pIVar6->pkeyPositions).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(pIVar6->pkeyPositions).
                         super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
          uVar20 = (uint)uVar9;
          paVar11->mNumPositionKeys = uVar20;
          paVar11->mNumScalingKeys =
               (int)((ulong)((long)(pIVar6->pkeyPositions).
                                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pIVar6->pkeyPositions).
                                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
          paVar11->mNumRotationKeys =
               (int)((ulong)((long)(pIVar6->pkeyPositions).
                                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pIVar6->pkeyPositions).
                                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
          uVar21 = (uVar9 & 0xffffffff) * 0x18;
          paVar12 = (aiVectorKey *)operator_new__(uVar21);
          if (uVar20 != 0) {
            uVar22 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar22);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar12->mValue).z + uVar22) = 0;
              uVar22 = uVar22 + 0x18;
            } while (uVar21 != uVar22);
          }
          local_464 = local_464 + 1;
          paVar11->mPositionKeys = paVar12;
          uVar22 = (uVar9 & 0xffffffff) * 0x18;
          paVar12 = (aiVectorKey *)operator_new__(uVar22);
          if (uVar20 == 0) {
            paVar11->mScalingKeys = paVar12;
            paVar14 = (aiQuatKey *)operator_new__(uVar22);
            paVar11->mRotationKeys = paVar14;
          }
          else {
            uVar19 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar12->mTime + uVar19);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar12->mValue).z + uVar19) = 0;
              uVar19 = uVar19 + 0x18;
            } while (uVar21 != uVar19);
            paVar11->mScalingKeys = paVar12;
            paVar13 = (aiQuatKey *)operator_new__(uVar22);
            paVar14 = paVar13;
            do {
              paVar14->mTime = 0.0;
              (paVar14->mValue).w = 1.0;
              (paVar14->mValue).x = 0.0;
              (paVar14->mValue).y = 0.0;
              (paVar14->mValue).z = 0.0;
              paVar14 = paVar14 + 1;
            } while (paVar14 != paVar13 + (uVar9 & 0xffffffff));
            paVar11->mRotationKeys = paVar13;
            if (uVar20 != 0) {
              lVar18 = 0;
              uVar21 = 0;
              do {
                paVar16 = (pIVar6->pkeyPositions).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar12 = paVar11->mPositionKeys;
                *(undefined4 *)((long)&(paVar12->mValue).z + lVar18) =
                     *(undefined4 *)((long)&(paVar16->mValue).z + lVar18);
                puVar1 = (undefined8 *)((long)&paVar16->mTime + lVar18);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&paVar12->mTime + lVar18);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                paVar16 = (pIVar6->pkeyScalings).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar12 = paVar11->mScalingKeys;
                *(undefined4 *)((long)&(paVar12->mValue).z + lVar18) =
                     *(undefined4 *)((long)&(paVar16->mValue).z + lVar18);
                puVar1 = (undefined8 *)((long)&paVar16->mTime + lVar18);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&paVar12->mTime + lVar18);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                paVar7 = (pIVar6->pkeyRotations).
                         super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                         super__Vector_impl_data._M_start;
                paVar14 = paVar11->mRotationKeys;
                *(undefined8 *)((long)&(paVar14->mValue).y + lVar18) =
                     *(undefined8 *)((long)&(paVar7->mValue).y + lVar18);
                puVar1 = (undefined8 *)((long)&paVar7->mTime + lVar18);
                uVar8 = puVar1[1];
                puVar2 = (undefined8 *)((long)&paVar14->mTime + lVar18);
                *puVar2 = *puVar1;
                puVar2[1] = uVar8;
                uVar21 = uVar21 + 1;
                lVar18 = lVar18 + 0x18;
              } while (uVar21 < paVar11->mNumPositionKeys);
            }
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < *(uint *)(puVar4 + 8));
    }
  }
  this->pScene->mNumAnimations = 1;
  ppaVar15 = (aiAnimation **)operator_new__(8);
  this->pScene->mAnimations = ppaVar15;
  *this->pScene->mAnimations = this_00;
  return;
}

Assistant:

void MDLImporter::BuildOutputAnims_3DGS_MDL7(
    const MDL::IntBone_MDL7** apcBonesOut)
{
    ai_assert(NULL != apcBonesOut);
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // one animation ...
    aiAnimation* pcAnim = new aiAnimation();
    for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
        if (!apcBonesOut[i]->pkeyPositions.empty()) {

            // get the last frame ... (needn't be equal to pcHeader->frames_num)
            for (size_t qq = 0; qq < apcBonesOut[i]->pkeyPositions.size();++qq) {
                pcAnim->mDuration = std::max(pcAnim->mDuration, (double)
                    apcBonesOut[i]->pkeyPositions[qq].mTime);
            }
            ++pcAnim->mNumChannels;
        }
    }
    if (pcAnim->mDuration)  {
        pcAnim->mChannels = new aiNodeAnim*[pcAnim->mNumChannels];

        unsigned int iCnt = 0;
        for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
            if (!apcBonesOut[i]->pkeyPositions.empty()) {
                const MDL::IntBone_MDL7* const intBone = apcBonesOut[i];

                aiNodeAnim* const pcNodeAnim = pcAnim->mChannels[iCnt++] = new aiNodeAnim();
                pcNodeAnim->mNodeName = aiString( intBone->mName );

                // allocate enough storage for all keys
                pcNodeAnim->mNumPositionKeys = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumScalingKeys  = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumRotationKeys = (unsigned int)intBone->pkeyPositions.size();

                pcNodeAnim->mPositionKeys = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mScalingKeys  = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mRotationKeys = new aiQuatKey[pcNodeAnim->mNumPositionKeys];

                // copy all keys
                for (unsigned int qq = 0; qq < pcNodeAnim->mNumPositionKeys;++qq)   {
                    pcNodeAnim->mPositionKeys[qq] = intBone->pkeyPositions[qq];
                    pcNodeAnim->mScalingKeys[qq] = intBone->pkeyScalings[qq];
                    pcNodeAnim->mRotationKeys[qq] = intBone->pkeyRotations[qq];
                }
            }
        }

        // store the output animation
        pScene->mNumAnimations = 1;
        pScene->mAnimations = new aiAnimation*[1];
        pScene->mAnimations[0] = pcAnim;
    }
    else delete pcAnim;
}